

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall mjs::parser::unhandled(parser *this,char *function,int line)

{
  size_t sVar1;
  ostream *os;
  runtime_error *this_00;
  ostringstream oss;
  string asStack_1b8 [32];
  long local_198 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Unhandled token in ",0x13);
  if (function == (char *)0x0) {
    std::ios::clear((int)asStack_1b8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x20);
  }
  else {
    sVar1 = strlen(function);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,function,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," line ",6);
  os = (ostream *)std::ostream::operator<<((ostream *)local_198,line);
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  mjs::operator<<(os,&this->current_token_);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void unhandled(const char* function, int line) {
        std::ostringstream oss;
        oss << "Unhandled token in " << function  << " line " << line << " " << current_token();
        throw std::runtime_error(oss.str());
    }